

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_set.cpp
# Opt level: O1

unique_ptr<duckdb::SetStatement,_std::default_delete<duckdb::SetStatement>,_true> __thiscall
duckdb::Transformer::TransformSetVariable(Transformer *this,PGVariableSetStmt *stmt)

{
  pointer pcVar1;
  ParsedExpression *pPVar2;
  SetScope scope_p;
  bool bVar3;
  pointer pPVar4;
  BaseExpression *this_00;
  ColumnRefExpression *this_01;
  string *psVar5;
  undefined1 this_02 [8];
  Transformer *this_03;
  NotImplementedException *this_04;
  ParserException *this_05;
  long in_RDX;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> expr;
  string name;
  Value val;
  undefined1 local_120 [8];
  ParserOptions *local_118;
  element_type *local_110;
  undefined1 local_108 [16];
  Value local_f8;
  Value local_b8;
  LogicalType local_78;
  string local_60;
  string local_40;
  
  if (*(int *)(in_RDX + 8) == 0) {
    this_04 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_f8.type_._0_8_ =
         &local_f8.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_108 + 0x10),"SET LOCAL is not implemented.","");
    NotImplementedException::NotImplementedException(this_04,(string *)(local_108 + 0x10));
    __cxa_throw(this_04,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::string::string
            ((string *)&local_118,*(char **)(in_RDX + 0x10),(allocator *)(local_108 + 0x10));
  if (*(int *)(*(long *)(in_RDX + 0x18) + 4) != 1) {
    this_05 = (ParserException *)__cxa_allocate_exception(0x10);
    local_f8.type_._0_8_ =
         &local_f8.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_108 + 0x10),"SET needs a single scalar value parameter","");
    ParserException::ParserException(this_05,(string *)(local_108 + 0x10));
    __cxa_throw(this_05,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
  }
  scope_p = anon_unknown_472::ToSetScope(*(VariableSetScope *)(in_RDX + 8));
  TransformExpression((Transformer *)local_120,(optional_ptr<duckdb_libpgquery::PGNode,_true>)stmt);
  pPVar4 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         *)local_120);
  if ((pPVar4->super_BaseExpression).type != COLUMN_REF) goto LAB_012949de;
  this_00 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)local_120)->super_BaseExpression;
  this_01 = BaseExpression::Cast<duckdb::ColumnRefExpression>(this_00);
  LogicalType::LogicalType(&local_78,SQLNULL);
  Value::Value(&local_b8,&local_78);
  LogicalType::~LogicalType(&local_78);
  bVar3 = ColumnRefExpression::IsQualified(this_01);
  if (bVar3) {
    pPVar4 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)local_120);
    (*(pPVar4->super_BaseExpression)._vptr_BaseExpression[8])(&local_40,pPVar4);
    Value::Value((Value *)(local_108 + 0x10),&local_40);
    Value::operator=(&local_b8,(Value *)(local_108 + 0x10));
    Value::~Value((Value *)(local_108 + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
LAB_01294986:
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  else {
    psVar5 = ColumnRefExpression::GetColumnName_abi_cxx11_(this_01);
    pcVar1 = (psVar5->_M_dataplus)._M_p;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar1,pcVar1 + psVar5->_M_string_length);
    Value::Value((Value *)(local_108 + 0x10),&local_60);
    Value::operator=(&local_b8,(Value *)(local_108 + 0x10));
    Value::~Value((Value *)(local_108 + 0x10));
    local_40._M_dataplus._M_p = local_60._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) goto LAB_01294986;
  }
  this_02 = (undefined1  [8])operator_new(0x78);
  Value::Value((Value *)(local_108 + 0x10),&local_b8);
  ConstantExpression::ConstantExpression((ConstantExpression *)this_02,(Value *)(local_108 + 0x10));
  Value::~Value((Value *)(local_108 + 0x10));
  if (local_120 != (undefined1  [8])0x0) {
    pPVar2 = (ParsedExpression *)local_120;
    local_120 = this_02;
    (*(pPVar2->super_BaseExpression)._vptr_BaseExpression[1])();
    this_02 = local_120;
  }
  local_120 = this_02;
  Value::~Value(&local_b8);
LAB_012949de:
  pPVar4 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         *)local_120);
  if ((pPVar4->super_BaseExpression).type == VALUE_DEFAULT) {
    this_03 = (Transformer *)operator_new(0xa0);
    local_f8.type_._0_8_ =
         &local_f8.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    if (local_118 == (ParserOptions *)local_108) {
      local_f8._24_8_ = local_108._8_8_;
    }
    else {
      local_f8.type_._0_8_ = local_118;
    }
    local_f8.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_110;
    local_110 = (element_type *)0x0;
    local_108[0] = false;
    local_118 = (ParserOptions *)local_108;
    ResetVariableStatement::ResetVariableStatement
              ((ResetVariableStatement *)this_03,(string *)(local_108 + 0x10),scope_p);
  }
  else {
    this_03 = (Transformer *)operator_new(0xa8);
    local_f8.type_._0_8_ =
         &local_f8.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    if (local_118 == (ParserOptions *)local_108) {
      local_f8._24_8_ = local_108._8_8_;
    }
    else {
      local_f8.type_._0_8_ = local_118;
    }
    local_f8.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_110;
    local_110 = (element_type *)0x0;
    local_108[0] = false;
    local_b8.type_.id_ = local_120[0];
    local_b8.type_.physical_type_ = local_120[1];
    local_b8.type_._2_6_ = local_120._2_6_;
    local_120 = (undefined1  [8])0x0;
    local_118 = (ParserOptions *)local_108;
    SetVariableStatement::SetVariableStatement
              ((SetVariableStatement *)this_03,(string *)(local_108 + 0x10),
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_b8,scope_p);
    if ((Transformer *)local_b8.type_._0_8_ != (Transformer *)0x0) {
      (*(((ParsedExpression *)local_b8.type_._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])
                ();
    }
    local_b8.type_._0_8_ = (_Hash_node_base *)0x0;
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_f8.type_._0_8_ !=
      &local_f8.type_.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
    operator_delete((void *)local_f8.type_._0_8_);
  }
  (this->parent).ptr = this_03;
  if (local_120 != (undefined1  [8])0x0) {
    (*(((ParsedExpression *)local_120)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  if (local_118 != (ParserOptions *)local_108) {
    operator_delete(local_118);
  }
  return (unique_ptr<duckdb::SetStatement,_std::default_delete<duckdb::SetStatement>_>)
         (unique_ptr<duckdb::SetStatement,_std::default_delete<duckdb::SetStatement>_>)this;
}

Assistant:

unique_ptr<SetStatement> Transformer::TransformSetVariable(duckdb_libpgquery::PGVariableSetStmt &stmt) {
	if (stmt.scope == duckdb_libpgquery::VariableSetScope::VAR_SET_SCOPE_LOCAL) {
		throw NotImplementedException("SET LOCAL is not implemented.");
	}

	string name(stmt.name);
	D_ASSERT(!name.empty()); // parser protect us!
	if (stmt.args->length != 1) {
		throw ParserException("SET needs a single scalar value parameter");
	}
	auto scope = ToSetScope(stmt.scope);
	D_ASSERT(stmt.args->head && stmt.args->head->data.ptr_value);
	auto const_val = PGPointerCast<duckdb_libpgquery::PGNode>(stmt.args->head->data.ptr_value);
	auto expr = TransformExpression(const_val);
	if (expr->GetExpressionType() == ExpressionType::COLUMN_REF) {
		auto &colref = expr->Cast<ColumnRefExpression>();
		Value val;
		if (!colref.IsQualified()) {
			val = Value(colref.GetColumnName());
		} else {
			val = Value(expr->ToString());
		}
		expr = make_uniq<ConstantExpression>(std::move(val));
	}
	if (expr->GetExpressionType() == ExpressionType::VALUE_DEFAULT) {
		// set to default = reset
		return make_uniq<ResetVariableStatement>(std::move(name), scope);
	}
	return make_uniq<SetVariableStatement>(std::move(name), std::move(expr), scope);
}